

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

size_t Assimp::parseMagic(uint8_t *data,uint8_t *dataEnd)

{
  char *__s;
  uint uVar1;
  int iVar2;
  size_t __n;
  byte *pbVar3;
  size_t local_58;
  ptrdiff_t xmlDeclarationLength;
  char *xmlDeclaration;
  size_t i;
  size_t xmlDeclarationsLength;
  uint32_t magic;
  uint8_t *dataEnd_local;
  uint8_t *data_local;
  
  if ((long)dataEnd - (long)data < 4) {
    data_local = (uint8_t *)0x0;
  }
  else {
    uVar1 = *(uint *)data;
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (uVar1 == 0xe0000001) {
      data_local = (uint8_t *)0x4;
    }
    else if (uVar1 == 0x3c3f786d) {
      for (xmlDeclaration = (char *)0x0; xmlDeclaration < (char *)0x9;
          xmlDeclaration = xmlDeclaration + 1) {
        __s = *(char **)(xmlDeclarations + (long)xmlDeclaration * 8);
        __n = strlen(__s);
        if (((long)__n <= (long)dataEnd - (long)data) && (iVar2 = memcmp(__s,data,__n), iVar2 == 0))
        {
          pbVar3 = data + __n;
          if ((long)dataEnd - (long)pbVar3 < 4) {
            return 0;
          }
          if (((uint)*pbVar3 << 0x18 | (uint)pbVar3[1] << 0x10 | (uint)pbVar3[2] << 8 |
              (uint)pbVar3[3]) == 0xe0000001) {
            local_58 = __n + 4;
          }
          else {
            local_58 = 0;
          }
          return local_58;
        }
      }
      data_local = (uint8_t *)0x0;
    }
    else {
      data_local = (uint8_t *)0x0;
    }
  }
  return (size_t)data_local;
}

Assistant:

static size_t parseMagic(const uint8_t *data, const uint8_t *dataEnd) {
    if (dataEnd - data < 4) {
        return 0;
    }
    uint32_t magic = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
    switch (magic) {
    case 0xe0000001:
        return 4;
    case 0x3c3f786d: // "<?xm"
        {
            size_t xmlDeclarationsLength = sizeof(xmlDeclarations) / sizeof(xmlDeclarations[0]);
            for (size_t i = 0; i < xmlDeclarationsLength; ++i) {
                auto xmlDeclaration = xmlDeclarations[i];
                ptrdiff_t xmlDeclarationLength = strlen(xmlDeclaration);
                if ((dataEnd - data >= xmlDeclarationLength) && (memcmp(xmlDeclaration, data, xmlDeclarationLength) == 0)) {
                    data += xmlDeclarationLength;
                    if (dataEnd - data < 4) {
                        return 0;
                    }
                    magic = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
                    return magic == 0xe0000001 ? xmlDeclarationLength + 4 : 0;
                }
            }
            return 0;
        }
    default:
        return 0;
    }
}